

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

qsizetype QtPrivate::lastIndexOf
                    (QLatin1StringView haystack,qsizetype from,QLatin1StringView needle,
                    CaseSensitivity cs)

{
  char32_t cVar1;
  int iVar2;
  qsizetype qVar3;
  anon_unknown_dwarf_bb6601 *paVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  anon_unknown_dwarf_bb6601 *paVar8;
  char *ch;
  byte *pbVar9;
  byte *pbVar10;
  anon_unknown_dwarf_bb6601 *this;
  long lVar11;
  long lVar12;
  byte *ch_00;
  ulong uVar13;
  bool bVar14;
  QLatin1String haystack_00;
  QLatin1StringView rhs;
  QLatin1StringView lhs;
  
  uVar6 = needle.m_size;
  haystack_00.m_size = (byte *)haystack.m_data;
  this = (anon_unknown_dwarf_bb6601 *)haystack.m_size;
  if (uVar6 == 1) {
    haystack_00.m_data._0_1_ = *needle.m_data;
    haystack_00.m_data._1_7_ = 0;
    qVar3 = anon_unknown.dwarf_bb6601::qLastIndexOf<QLatin1String>
                      (this,haystack_00,(QChar)(char16_t)from,(ulong)cs,cs);
    return qVar3;
  }
  paVar4 = (anon_unknown_dwarf_bb6601 *)((from >> 0x3f & (ulong)this) + from);
  if (paVar4 != this || uVar6 != 0) {
    paVar8 = this + -uVar6;
    bVar14 = paVar4 <= this;
    this = (anon_unknown_dwarf_bb6601 *)0xffffffffffffffff;
    if (-1 < (long)paVar8 && bVar14) {
      if ((long)paVar4 < (long)paVar8) {
        paVar8 = paVar4;
      }
      pbVar10 = haystack_00.m_size + (long)paVar8;
      uVar7 = uVar6 - 1;
      if (uVar6 == 0) {
        uVar7 = 0;
      }
      ch = needle.m_data + uVar7;
      ch_00 = pbVar10 + uVar7;
      uVar13 = 0;
      if (0 < (long)uVar6) {
        uVar13 = uVar6;
      }
      if (cs == CaseSensitive) {
        lVar12 = 0;
        lVar11 = 0;
        for (lVar5 = 0; -lVar5 != uVar13; lVar5 = lVar5 + -1) {
          lVar11 = (ulong)(byte)ch[lVar5] + lVar11 * 2;
          lVar12 = (ulong)ch_00[lVar5] + lVar12 * 2;
        }
        lVar12 = lVar12 - (ulong)*pbVar10;
        for (; pbVar10 = haystack_00.m_size + (long)paVar8, haystack_00.m_size <= pbVar10;
            paVar8 = paVar8 + -1) {
          lVar12 = lVar12 + (ulong)*pbVar10;
          if ((lVar12 == lVar11) &&
             (rhs.m_data = (char *)pbVar10, rhs.m_size = uVar6,
             iVar2 = compareStrings(needle,rhs,CaseSensitive), iVar2 == 0)) {
            return (qsizetype)paVar8;
          }
          if (uVar7 < 0x40) {
            lVar12 = lVar12 - ((ulong)(haystack_00.m_size + (uVar6 - 1))[(long)paVar8] <<
                              ((byte)uVar7 & 0x3f));
          }
          lVar12 = lVar12 * 2;
        }
      }
      else {
        lVar12 = 0;
        lVar11 = 0;
        pbVar9 = haystack_00.m_size;
        while (bVar14 = uVar13 != 0, uVar13 = uVar13 - 1, bVar14) {
          cVar1 = (anonymous_namespace)::foldCaseHelper<char_const*>(ch,(char *)pbVar9);
          lVar11 = (ulong)(uint)cVar1 + lVar11 * 2;
          cVar1 = (anonymous_namespace)::foldCaseHelper<char_const*>((char *)ch_00,(char *)pbVar9);
          lVar12 = (ulong)(uint)cVar1 + lVar12 * 2;
          ch_00 = ch_00 + -1;
          ch = ch + -1;
        }
        cVar1 = (anonymous_namespace)::foldCaseHelper<char_const*>((char *)pbVar10,(char *)pbVar9);
        lVar12 = lVar12 - (ulong)(uint)cVar1;
        for (; pbVar10 = haystack_00.m_size + (long)paVar8, haystack_00.m_size <= pbVar10;
            paVar8 = paVar8 + -1) {
          cVar1 = (anonymous_namespace)::foldCaseHelper<char_const*>((char *)pbVar10,(char *)pbVar9)
          ;
          lVar12 = lVar12 + (ulong)(uint)cVar1;
          if ((lVar12 == lVar11) &&
             (lhs.m_data = (char *)pbVar10, lhs.m_size = uVar6,
             iVar2 = compareStrings(lhs,needle,CaseInsensitive), pbVar9 = pbVar10, iVar2 == 0)) {
            return (qsizetype)paVar8;
          }
          if (uVar7 < 0x40) {
            cVar1 = (anonymous_namespace)::foldCaseHelper<char_const*>
                              ((char *)(haystack_00.m_size + uVar6 + (long)paVar8 + -1),
                               (char *)pbVar9);
            lVar12 = lVar12 - ((ulong)(uint)cVar1 << ((byte)uVar7 & 0x3f));
          }
          lVar12 = lVar12 * 2;
        }
      }
      this = (anon_unknown_dwarf_bb6601 *)0xffffffffffffffff;
    }
  }
  return (qsizetype)this;
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QLatin1StringView haystack, qsizetype from, QLatin1StringView needle, Qt::CaseSensitivity cs) noexcept
{
    return qLastIndexOf(haystack, from, needle, cs);
}